

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
jsoncons::detail::optional<std::vector<double,_std::allocator<double>_>_>::swap
          (optional<std::vector<double,_std::allocator<double>_>_> *this,
          optional<std::vector<double,_std::allocator<double>_>_> *other)

{
  bool bVar1;
  _Vector_impl_data *this_00;
  _Vector_impl_data *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  optional<std::vector<double,_std::allocator<double>_>_> *this_01;
  optional<std::vector<double,_std::allocator<double>_>_> local_38;
  
  bVar1 = this->has_value_;
  if (bVar1 == other->has_value_) {
    if (bVar1 != false) {
      this_00 = (_Vector_impl_data *)value(this);
      __x = (_Vector_impl_data *)value(other);
      std::_Vector_base<double,_std::allocator<double>_>::_Vector_impl_data::_M_swap_data
                (this_00,__x);
      return;
    }
  }
  else {
    this_01 = this;
    if (bVar1 != false) {
      this_01 = other;
      other = this;
    }
    __x_00 = value(other);
    local_38.has_value_ = true;
    std::vector<double,_std::allocator<double>_>::vector(&local_38.field_1.value_,__x_00);
    operator=(this_01,&local_38);
    destroy(&local_38);
    destroy(other);
  }
  return;
}

Assistant:

void swap(optional& other) noexcept(std::is_nothrow_move_constructible<T>::value /*&&
                                            std::is_nothrow_swappable<T>::value*/)
        {
            const bool contains_a_value = has_value();
            if (contains_a_value == other.has_value())
            {
                if (contains_a_value)
                {
                    using std::swap;
                    swap(**this, *other);
                }
            }
            else
            {
                optional& source = contains_a_value ? *this : other;
                optional& target = contains_a_value ? other : *this;
                target = optional<T>(*source);
                source.reset();
            }
        }